

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O1

void conv_fmt_16to8bit_c(uchar *src_y,uchar *src_uv,uchar **dst,int width,int height,int src_stride,
                        int src_stridec,int *dst_stride,int uv_shift)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  uchar *puVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  uchar *puVar9;
  
  if (0 < height) {
    iVar2 = *dst_stride;
    puVar9 = *dst;
    iVar4 = 0;
    do {
      if (0 < width) {
        uVar6 = 0;
        do {
          puVar9[uVar6] = src_y[uVar6 * 2];
          uVar6 = uVar6 + 1;
        } while ((uint)width != uVar6);
      }
      puVar9 = puVar9 + iVar2;
      iVar4 = iVar4 + 1;
      src_y = src_y + (long)(src_stride >> 1) * 2;
    } while (iVar4 != height);
  }
  uVar1 = width >> ((byte)uv_shift & 0x1f);
  iVar2 = height >> ((byte)uv_shift & 0x1f);
  if (0 < iVar2) {
    iVar4 = dst_stride[1];
    puVar3 = dst[1];
    iVar8 = 0;
    puVar9 = src_uv;
    do {
      if (0 < (int)uVar1) {
        lVar7 = 0;
        puVar5 = puVar3;
        do {
          *puVar5 = puVar9[(long)(int)lVar7 * 2];
          lVar7 = lVar7 + 2;
          puVar5 = puVar5 + 1;
        } while ((ulong)uVar1 * 2 != lVar7);
      }
      puVar9 = puVar9 + (long)(src_stridec >> 1) * 2;
      puVar3 = puVar3 + iVar4;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar2);
  }
  if (0 < iVar2) {
    iVar4 = dst_stride[2];
    puVar3 = dst[2];
    puVar9 = src_uv + 2;
    iVar8 = 0;
    do {
      if (0 < (int)uVar1) {
        lVar7 = 0;
        puVar5 = puVar3;
        do {
          *puVar5 = puVar9[(long)(int)lVar7 * 2];
          lVar7 = lVar7 + 2;
          puVar5 = puVar5 + 1;
        } while ((ulong)uVar1 * 2 != lVar7);
      }
      puVar9 = puVar9 + (long)(src_stridec >> 1) * 2;
      puVar3 = puVar3 + iVar4;
      iVar8 = iVar8 + 1;
    } while (iVar8 != iVar2);
  }
  return;
}

Assistant:

static void conv_fmt_16to8bit_c(unsigned char* src_y, unsigned char* src_uv, unsigned char* dst[3], int width, int height, int src_stride, int src_stridec, int dst_stride[3], int uv_shift) {
    int i, j;
    short* psrc = (short*)src_y;
    unsigned char* pdst = dst[0];
    int i_dst, i_src;

    i_src = src_stride >> 1;
    i_dst = dst_stride[0];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    width >>= uv_shift;
    height >>= uv_shift;

    psrc = (short*)src_uv;
    pdst = dst[1];
    i_src = src_stridec >> 1;
    i_dst = dst_stride[1];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }

    psrc = ((short*)src_uv) + 1;
    pdst = dst[2];
    i_dst = dst_stride[2];
    for (i = 0; i < height; i++) {
        for (j = 0; j < width; j++) {
            pdst[j] = (unsigned char)psrc[j << 1];
        }
        psrc += i_src;
        pdst += i_dst;
    }
}